

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_Node * UA_NodeStore_getCopy(UA_NodeStore *ns,UA_NodeId *nodeid)

{
  UA_NodeStoreEntry *pUVar1;
  UA_StatusCode UVar2;
  UA_NodeStoreEntry **ppUVar3;
  UA_NodeStoreEntry *__ptr;
  UA_Node *dst;
  
  ppUVar3 = findNode(ns,nodeid);
  if (ppUVar3 != (UA_NodeStoreEntry **)0x0) {
    pUVar1 = *ppUVar3;
    __ptr = instantiateEntry((pUVar1->node).nodeClass);
    if (__ptr != (UA_NodeStoreEntry *)0x0) {
      dst = &__ptr->node;
      UVar2 = UA_Node_copyAnyNodeClass(&pUVar1->node,dst);
      if (UVar2 == 0) {
        __ptr->orig = pUVar1;
        return dst;
      }
      UA_Node_deleteMembersAnyNodeClass(dst);
      free(__ptr);
    }
  }
  return (UA_Node *)0x0;
}

Assistant:

UA_Node *
UA_NodeStore_getCopy(UA_NodeStore *ns, const UA_NodeId *nodeid) {
    UA_NodeStoreEntry **slot = findNode(ns, nodeid);
    if(!slot)
        return NULL;
    UA_NodeStoreEntry *entry = *slot;
    UA_NodeStoreEntry *new = instantiateEntry(entry->node.nodeClass);
    if(!new)
        return NULL;
    if(UA_Node_copyAnyNodeClass(&entry->node, &new->node) != UA_STATUSCODE_GOOD) {
        deleteEntry(new);
        return NULL;
    }
    new->orig = entry; // store the pointer to the original
    return &new->node;
}